

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

fdb_status fdb_get_kvs_name_list(fdb_file_handle *fhandle,fdb_kvs_name_list *kvs_name_list)

{
  char *pcVar1;
  char *__dest;
  kvs_header *pkVar2;
  fdb_status fVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  size_t sVar6;
  char **ppcVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  
  if (fhandle != (fdb_file_handle *)0x0) {
    if (kvs_name_list == (fdb_kvs_name_list *)0x0) {
      fVar3 = FDB_RESULT_INVALID_ARGS;
    }
    else {
      pkVar2 = fhandle->root->file->kv_header;
      pthread_spin_lock(&pkVar2->lock);
      paVar4 = avl_first(pkVar2->idx_id);
      sVar8 = 1;
      lVar9 = 8;
      lVar10 = lVar9;
      while (paVar4 != (avl_node *)0x0) {
        paVar5 = avl_next(paVar4);
        sVar8 = sVar8 + 1;
        sVar6 = strlen((char *)paVar4[-8].left);
        lVar10 = lVar10 + sVar6 + 1;
        lVar9 = lVar9 + 8;
        paVar4 = paVar5;
      }
      ppcVar7 = (char **)calloc(1,lVar10 + lVar9);
      kvs_name_list->num_kvs_names = sVar8;
      kvs_name_list->kvs_names = ppcVar7;
      pcVar1 = (char *)((long)ppcVar7 + lVar9);
      *(undefined8 *)((long)ppcVar7 + lVar9) = 0x746c7561666564;
      *ppcVar7 = pcVar1;
      paVar4 = avl_first(pkVar2->idx_name);
      lVar9 = 8;
      while (ppcVar7 = ppcVar7 + 1, paVar4 != (avl_node *)0x0) {
        paVar5 = avl_next(paVar4);
        __dest = pcVar1 + lVar9;
        strcpy(__dest,(char *)paVar4[-7].left);
        *ppcVar7 = __dest;
        sVar6 = strlen((char *)paVar4[-7].left);
        lVar9 = lVar9 + sVar6 + 1;
        paVar4 = paVar5;
      }
      pthread_spin_unlock(&pkVar2->lock);
      fVar3 = FDB_RESULT_SUCCESS;
    }
    return fVar3;
  }
  return FDB_RESULT_INVALID_HANDLE;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_kvs_name_list(fdb_file_handle *fhandle,
                                 fdb_kvs_name_list *kvs_name_list)
{
    size_t num, size, offset;
    char *ptr;
    char **segment;
    fdb_kvs_handle *root_handle;
    struct kvs_header *kv_header;
    struct kvs_node *node;
    struct avl_node *a;

    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!kvs_name_list) {
        return FDB_RESULT_INVALID_ARGS;
    }

    root_handle = fhandle->root;
    kv_header = root_handle->file->kv_header;

    spin_lock(&kv_header->lock);
    // sum all lengths of KVS names first
    // (to calculate the size of memory segment to be allocated)
    num = 1;
    size = strlen(default_kvs_name) + 1;
    a = avl_first(kv_header->idx_id);
    while (a) {
        node = _get_entry(a, struct kvs_node, avl_id);
        a = avl_next(&node->avl_id);

        num++;
        size += strlen(node->kvs_name) + 1;
    }
    size += num * sizeof(char*);

    // allocate memory segment
    segment = (char**)calloc(1, size);
    kvs_name_list->num_kvs_names = num;
    kvs_name_list->kvs_names = segment;

    ptr = (char*)segment + num * sizeof(char*);
    offset = num = 0;

    // copy default KVS name
    strcpy(ptr + offset, default_kvs_name);
    segment[num] = ptr + offset;
    num++;
    offset += strlen(default_kvs_name) + 1;

    // copy the others
    a = avl_first(kv_header->idx_name);
    while (a) {
        node = _get_entry(a, struct kvs_node, avl_name);
        a = avl_next(&node->avl_name);

        strcpy(ptr + offset, node->kvs_name);
        segment[num] = ptr + offset;

        num++;
        offset += strlen(node->kvs_name) + 1;
    }

    spin_unlock(&kv_header->lock);

    return FDB_RESULT_SUCCESS;
}